

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ImplicitWeakMessage::New(ImplicitWeakMessage *this)

{
  MessageLite *pMVar1;
  
  pMVar1 = (MessageLite *)operator_new(0x30);
  (pMVar1->_internal_metadata_).ptr_ = (void *)0x0;
  pMVar1->_vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_0020bcd8;
  pMVar1[1]._vptr_MessageLite = (_func_int **)(pMVar1 + 2);
  pMVar1[1]._internal_metadata_.ptr_ = (void *)0x0;
  *(undefined1 *)&pMVar1[2]._vptr_MessageLite = 0;
  return pMVar1;
}

Assistant:

MessageLite* New() const override { return new ImplicitWeakMessage; }